

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTADSBHub.cpp
# Opt level: O3

bool __thiscall
ADSBHubConnection::StreamProcessDataSBS(ADSBHubConnection *this,size_t num,char *buffer)

{
  char *pStart;
  bool bVar1;
  int iVar2;
  char *pEnd;
  
  pEnd = (char *)memchr(buffer,10,num);
  if (pEnd != (char *)0x0) {
    do {
      if ((this->lnLeftOver)._M_string_length == 0) {
        bVar1 = StreamProcessDataSBSLine(this,buffer,pEnd);
        if ((!bVar1) &&
           (iVar2 = (*(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel.
                      _vptr_LTChannel[8])(this), (char)iVar2 == '\0')) {
          return false;
        }
      }
      else {
        std::__cxx11::string::append((char *)&this->lnLeftOver,(ulong)buffer);
        pStart = (this->lnLeftOver)._M_dataplus._M_p;
        bVar1 = StreamProcessDataSBSLine
                          (this,pStart,pStart + ((this->lnLeftOver)._M_string_length - 1));
        if ((!bVar1) &&
           (iVar2 = (*(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel.
                      _vptr_LTChannel[8])(this), (char)iVar2 == '\0')) {
          (this->lnLeftOver)._M_string_length = 0;
          *(this->lnLeftOver)._M_dataplus._M_p = '\0';
          return false;
        }
        (this->lnLeftOver)._M_string_length = 0;
        *(this->lnLeftOver)._M_dataplus._M_p = '\0';
      }
      num = num - (long)(pEnd + (1 - (long)buffer));
      buffer = pEnd + 1;
      pEnd = (char *)memchr(buffer,10,num);
    } while (pEnd != (char *)0x0);
  }
  if (num == 0) {
    ProcessPlaneData(this);
  }
  else {
    std::__cxx11::string::append((char *)&this->lnLeftOver,(ulong)buffer);
  }
  (*(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel._vptr_LTChannel[9])
            (this);
  return true;
}

Assistant:

bool ADSBHubConnection::StreamProcessDataSBS (size_t num, const char* buffer)
{
    // reading pointer into buffer: beginning and end of a line
    const char* pStart = buffer;            // beginning of a line
    const char* pEnd = (const char*)std::memchr(pStart, '\n', num);
    
    // Loop for all complete lines found
    while (pEnd)
    {
        const size_t len = size_t(pEnd-pStart +1);
        
        // Any left overs from previous message?
        if (!lnLeftOver.empty()) {
            lnLeftOver.append(pStart, len);
            if (!StreamProcessDataSBSLine(lnLeftOver.c_str(), lnLeftOver.c_str() + lnLeftOver.length() -1) &&
                !IncErrCnt())
            {
                lnLeftOver.clear();     // too many errors, bail
                return false;
            }
            lnLeftOver.clear();         // left overs now processed
        }
        // Process full line directly from received data
        else {
            if (!StreamProcessDataSBSLine(pStart, pEnd) &&
                !IncErrCnt())
                return false;           // too many errors, bail
        }
        // Advance to next line in the data
        num -= len;                     // have processed `len` chars
        pStart = pEnd + 1;              // next line starts _after_ the CR
        pEnd = (const char*)std::memchr(pStart, '\n', num);
    }
    
    // Any left overs? Save for later
    if (num > 0)
        lnLeftOver.append(pStart, num);
    else
        // If the entire network message _exactly_ ended with a full line then assume we're done completely and also process that last plane data
        ProcessPlaneData();
    
    // Success
    DecErrCnt();                        // reduce error counter with each fully processed message
    return true;
}